

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderTextureSizeTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureSizeCase::verifyImage
          (TextureSizeCase *this,Surface *dst)

{
  int iVar1;
  RenderTarget *pRVar2;
  PixelFormat *pPVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  int iVar6;
  MessageBuilder local_640;
  MessageBuilder local_4c0;
  MessageBuilder local_340;
  MessageBuilder local_1b0;
  RGBA local_30;
  int local_2c;
  RGBA color;
  int colorThresholdBlue;
  int colorThresholdGreen;
  int colorThresholdRed;
  Surface *dst_local;
  TextureSizeCase *this_local;
  
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  pPVar3 = tcu::RenderTarget::getPixelFormat(pRVar2);
  iVar6 = 1 << (8U - (char)pPVar3->redBits & 0x1f);
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  pPVar3 = tcu::RenderTarget::getPixelFormat(pRVar2);
  color.m_value = 1 << (8U - (char)pPVar3->greenBits & 0x1f);
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  pPVar3 = tcu::RenderTarget::getPixelFormat(pRVar2);
  local_2c = 1 << (8U - (char)pPVar3->blueBits & 0x1f);
  local_30 = tcu::Surface::getPixel(dst,0,0);
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1b0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [17])"Verifying image.");
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  iVar1 = tcu::RGBA::getRed(&local_30);
  if (((iVar1 < iVar6) &&
      (iVar1 = tcu::RGBA::getGreen(&local_30), (int)(0xff - color.m_value) < iVar1)) &&
     (iVar1 = tcu::RGBA::getBlue(&local_30), iVar1 < local_2c)) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_340,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_340,(char (*) [11])"Result ok.");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_340);
    return true;
  }
  iVar1 = tcu::RGBA::getRed(&local_30);
  if (((0xff - iVar6 < iVar1) &&
      (iVar1 = tcu::RGBA::getGreen(&local_30), iVar1 < (int)color.m_value)) &&
     (iVar1 = tcu::RGBA::getBlue(&local_30), iVar1 < local_2c)) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_4c0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_4c0,(char (*) [22])"Image size incorrect.");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4c0);
    return false;
  }
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_640,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (&local_640,(char (*) [41])"Expected either green or red pixel, got ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_30);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_640);
  return false;
}

Assistant:

bool TextureSizeCase::verifyImage (const tcu::Surface& dst)
{
	DE_ASSERT(dst.getWidth() == 1 && dst.getHeight() == 1);

	const int		colorThresholdRed	= 1 << (8 - m_context.getRenderTarget().getPixelFormat().redBits);
	const int		colorThresholdGreen	= 1 << (8 - m_context.getRenderTarget().getPixelFormat().greenBits);
	const int		colorThresholdBlue	= 1 << (8 - m_context.getRenderTarget().getPixelFormat().blueBits);
	const tcu::RGBA	color				= dst.getPixel(0,0);

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying image." << tcu::TestLog::EndMessage;

	// green
	if (color.getRed() < colorThresholdRed && color.getGreen() > 255 - colorThresholdGreen && color.getBlue() < colorThresholdBlue)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Result ok." << tcu::TestLog::EndMessage;
		return true;
	}
	// red
	else if (color.getRed() > 255 - colorThresholdRed && color.getGreen() < colorThresholdGreen && color.getBlue() < colorThresholdBlue)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Image size incorrect." << tcu::TestLog::EndMessage;
		return false;
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Expected either green or red pixel, got " << color << tcu::TestLog::EndMessage;
	return false;
}